

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

string * __thiscall
Diligent::FormatString<char[50],char_const*,char[16],char_const*,char[4],char[128]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [50],char **Args_1,
          char (*Args_2) [16],char **Args_3,char (*Args_4) [4],char (*Args_5) [128])

{
  stringstream ss;
  stringstream local_1b8 [392];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[50],char_const*,char[16],char_const*,char[4],char[128]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [50])this,(char **)Args,(char (*) [16])Args_1,(char **)Args_2,
             (char (*) [4])Args_3,(char (*) [128])Args_4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}